

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex00m1.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  istream *this;
  size_type sVar2;
  const_reference pvVar3;
  reference piVar4;
  ostream *poVar5;
  int *e;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  pair<int,_int> local_a8;
  value_type local_a0;
  value_type top;
  undefined1 local_90 [4];
  int i;
  vector<int,_std::allocator<int>_> time;
  int local_70 [2];
  int x;
  int i_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_58;
  undefined1 local_38 [8];
  priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
  wait;
  int iStack_10;
  Comp c;
  int M;
  int N;
  
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&stack0xfffffffffffffff0);
  std::istream::operator>>(this,(int *)&wait.field_0x1c);
  local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector(&local_58);
  std::
  priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
  ::priority_queue((priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
                    *)local_38,(Comp *)&wait.field_0x1b,&local_58);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(&local_58);
  x = 0;
  do {
    if (iStack_10 <= x) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_90);
      top.second = 1;
      while( true ) {
        sVar2 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_90);
        if ((ulong)((long)(int)wait._28_4_ - (long)iStack_10) <= sVar2) break;
        pvVar3 = std::
                 priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
                 ::top((priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
                        *)local_38);
        if (pvVar3->first <= top.second) {
          pvVar3 = std::
                   priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
                   ::top((priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
                          *)local_38);
          local_a0 = *pvVar3;
          std::
          priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
          ::pop((priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
                 *)local_38);
          std::vector<int,std::allocator<int>>::emplace_back<int&>
                    ((vector<int,std::allocator<int>> *)local_90,&local_a0.first);
          __range1._4_4_ = local_a0.first + local_a0.second;
          local_a8 = std::make_pair<int,int&>((int *)((long)&__range1 + 4),&local_a0.second);
          std::
          priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
          ::push((priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
                  *)local_38,&local_a8);
        }
        top.second = top.second + 1;
      }
      __end1 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)local_90);
      e = (int *)std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)local_90);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)&e);
        if (!bVar1) break;
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar4);
        std::operator<<(poVar5,"\n");
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end1);
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90)
      ;
      local_70[1] = 0;
LAB_001015a6:
      std::
      priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
      ::~priority_queue((priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
                         *)local_38);
      return 0;
    }
    if (x == wait._28_4_) {
      local_70[1] = 1;
      goto LAB_001015a6;
    }
    std::istream::operator>>((istream *)&std::cin,local_70);
    time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)std::make_pair<int&,int&>(local_70,local_70);
    std::
    priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
    ::push((priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_Comp>
            *)local_38,
           (value_type *)
           &time.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage);
    std::operator<<((ostream *)&std::cout,"0\n");
    x = x + 1;
  } while( true );
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);

    int N, M;
    cin >> N >> M;
    Comp c;
    priority_queue<pii, vector<pii>, Comp> wait(c);
    for (int i = 0; i < N; ++i) {
        if (i == M) return 0;
        int x;
        cin >> x;
        wait.push(make_pair(x, x));
        cout << "0\n";
    }
    vector<int> time;
    int i = 1;
    while (time.size() < (size_t)M-N) {
        if (wait.top().first <= i) {
            auto top = wait.top();
            wait.pop();
            time.emplace_back(top.first);
            wait.push(make_pair(top.first + top.second,
                                top.second));
        }
        ++i;
    }

    for (auto &e : time) {
        cout << e << "\n";
    }
}